

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O0

double getCost0(int i)

{
  char *pcVar1;
  char *c7;
  basic_istream<char,_std::char_traits<char>_> *__in;
  size_t sVar2;
  double dStack_5070;
  int len;
  double ans;
  char strAns [10000];
  char buffer [10000];
  ifstream local_230 [8];
  ifstream infile;
  char *command;
  char *defaultFile;
  char *temp_File;
  int i_local;
  
  pcVar1 = catStrIntStr(energyFileAddress,"tempFile/temp_",i,".pdb");
  c7 = catStrIntStr(energyFileAddress,"/defaultFile/default",i,".sc");
  pcVar1 = catStrStr(scoreAddress," -database ",databaseAddress," -s ",pcVar1,
                     " -out:file:scorefile ",c7);
  system(pcVar1);
  std::ifstream::ifstream(local_230);
  openFile(c7,local_230);
  std::istream::getline((char *)local_230,(long)(strAns + 0x2708));
  __in = std::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_230,strAns + 0x2708);
  std::operator>>(__in,(char *)&ans);
  sVar2 = strlen((char *)&ans);
  if ((ans._0_1_ == 'n') || ((1 < (int)sVar2 && (ans._1_1_ == 'n')))) {
    dStack_5070 = 100000000.0;
  }
  else {
    dStack_5070 = atof((char *)&ans);
  }
  std::ifstream::close();
  removeFile(c7);
  std::ifstream::~ifstream(local_230);
  return dStack_5070;
}

Assistant:

double getCost0(int i) {
    //remove("/home/ws/zzZyj/data/temp1.pdb"); remove("default.sc");
    /*system("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease -database \
                   /home/ws/GL/rosetta_database/ \
                   -s /home/ws/zzZyj/data/energyFile/tempFile/temp_1.pdb \
                   -out:file:scorefile /home/ws/zzZyj/data/default0.sc");*/
    const char *temp_File = catStrIntStr(energyFileAddress, "tempFile/temp_", i, ".pdb");
    const char *defaultFile = catStrIntStr(energyFileAddress, "/defaultFile/default", i, ".sc");
    /*const char *command = catStrStr("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease \
                                            -database /home/ws/GL/rosetta_database/ -s ",
                    temp_File, " -out:file:scorefile ", defaultFile);*/
    const char *command = catStrStr(scoreAddress, " -database ", databaseAddress," -s ",
                                    temp_File, " -out:file:scorefile ", defaultFile);
    system(command);
    ifstream infile;
    openFile(defaultFile, infile);
    char buffer[10000], strAns[10000];
    double ans=0;
    infile.getline(buffer, 10000);
    infile >> buffer >> strAns;
    int len = strlen(strAns);
    if (strAns[0]=='n' || (len>=2 && strAns[1]=='n'))
        ans = INF;
    else
        ans = atof(strAns);
    infile.close();
    removeFile(defaultFile);
    return ans;
}